

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int nni_msg_header_trim(nni_msg *m,size_t len)

{
  int iVar1;
  
  iVar1 = 3;
  if (len <= m->m_header_len) {
    memmove(m,(void *)((long)m->m_header_buf + len),m->m_header_len - len);
    m->m_header_len = m->m_header_len - len;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_msg_header_trim(nni_msg *m, size_t len)
{
	if (len > m->m_header_len) {
		return (NNG_EINVAL);
	}
	memmove(m->m_header_buf, ((uint8_t *) m->m_header_buf) + len,
	    m->m_header_len - len);
	m->m_header_len -= len;
	return (0);
}